

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O2

string * __thiscall
MinVR::VRDataIndex::addData(string *__return_storage_ptr__,VRDataIndex *this,string *keyAndValue)

{
  bool bVar1;
  long lVar2;
  VRError *this_00;
  VRDataIndex *this_01;
  allocator<char> local_10f;
  allocator<char> local_10e;
  allocator<char> local_10d;
  int local_10c;
  string key;
  string value;
  VRCORETYPE_ID type;
  string local_a8;
  string local_88;
  string local_68;
  
  lVar2 = std::__cxx11::string::find((char *)keyAndValue,0x14057d);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&key,(ulong)keyAndValue);
    std::__cxx11::string::substr((ulong)&value,(ulong)keyAndValue);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffb8,"/",(allocator<char> *)&local_a8);
    bVar1 = exists(this,&key,(string *)&stack0xffffffffffffffb8,true);
    this_01 = (VRDataIndex *)&stack0xffffffffffffffb8;
    std::__cxx11::string::~string((string *)this_01);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"",(allocator<char> *)&local_a8);
      type = getType(this,&key,&local_68,true);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      type = _inferType(this_01,&value);
    }
    std::__cxx11::string::string((string *)&local_88,(string *)&value);
    _processValue(__return_storage_ptr__,this,&key,&type,&local_88,',');
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&key);
    return __return_storage_ptr__;
  }
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  std::operator+(&key,"MinVR Error: Expected a key=value format for the string: ",keyAndValue);
  std::__cxx11::string::string<std::allocator<char>>((string *)&value,"",&local_10d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.cpp"
             ,&local_10e);
  local_10c = 0x498;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"std::string MinVR::VRDataIndex::addData(const std::string &)",
             &local_10f);
  VRError::VRError(this_00,&key,&value,(string *)&type,&local_10c,&local_a8);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

std::string VRDataIndex::addData(const std::string &keyAndValue) {

  size_t poseql = keyAndValue.find("=");
  if (poseql == std::string::npos) {
    VRERRORNOADV("MinVR Error: Expected a key=value format for the string: " +
                 keyAndValue);
  }
  std::string key = keyAndValue.substr(0,poseql);
  std::string value = keyAndValue.substr(poseql+1);

  //  std::cout << "MinVR: Setting config value: " << key << "=" << value << std::endl;

  // If the key already exists, then match the existing type, otherwise infer
  // the type as usual.
  VRCORETYPE_ID type;
  if (exists(key, "/")) {
    type = getType(key);

  } else {

    type = _inferType(value);
  }

  // Got the name, type, value.  Go ahead and insert it into the index.
  return _processValue(key, type, value, MINVRSEPARATOR);
}